

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

char * food_xname(obj *food,boolean the_pfx)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((food->otyp == 0x10e) && (iVar1 = food->corpsenm, (mons[iVar1].geno & 0x1000) != 0)) {
    pcVar2 = xname(food);
    if (the_pfx == '\0') {
      pcVar4 = "";
    }
    else {
      pcVar4 = "";
      if ((mons[iVar1].mflags2 & 0x80000) == 0) {
        pcVar4 = "the ";
      }
    }
    pcVar3 = mons_mname(mons + iVar1);
    pcVar3 = s_suffix(pcVar3);
    sprintf(pcVar2,"%s%s corpse",pcVar4,pcVar3);
  }
  else {
    pcVar2 = singular(food,xname);
    if (the_pfx != '\0') {
      pcVar2 = the(pcVar2);
      return pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

static const char *food_xname(struct obj *food, boolean the_pfx)
{
	const char *result;
	int mnum = food->corpsenm;

	if (food->otyp == CORPSE && (mons[mnum].geno & G_UNIQ)) {
	    /* grab xname()'s modifiable return buffer for our own use */
	    char *bufp = xname(food);
	    sprintf(bufp, "%s%s corpse",
		    (the_pfx && !type_is_pname(&mons[mnum])) ? "the " : "",
		    s_suffix(mons_mname(&mons[mnum])));
	    result = bufp;
	} else {
	    /* the ordinary case */
	    result = singular(food, xname);
	    if (the_pfx) result = the(result);
	}
	return result;
}